

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

http_parser * __thiscall cinatra::http_parser::operator=(http_parser *this,http_parser *param_1)

{
  char *pcVar1;
  
  this->status_ = param_1->status_;
  pcVar1 = (param_1->msg_)._M_str;
  (this->msg_)._M_len = (param_1->msg_)._M_len;
  (this->msg_)._M_str = pcVar1;
  memcpy(&this->num_headers_,&param_1->num_headers_,0xca0);
  pcVar1 = (param_1->method_)._M_str;
  (this->method_)._M_len = (param_1->method_)._M_len;
  (this->method_)._M_str = pcVar1;
  pcVar1 = (param_1->url_)._M_str;
  (this->url_)._M_len = (param_1->url_)._M_len;
  (this->url_)._M_str = pcVar1;
  pcVar1 = (param_1->full_url_)._M_str;
  (this->full_url_)._M_len = (param_1->full_url_)._M_len;
  (this->full_url_)._M_str = pcVar1;
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->queries_)._M_h,&(param_1->queries_)._M_h);
  return this;
}

Assistant:

void parse_body_len() {
    auto header_value = this->get_header_value("content-length"sv);
    if (header_value.empty()) {
      body_len_ = 0;
    }
    else {
      auto [ptr, ec] = std::from_chars(
          header_value.data(), header_value.data() + header_value.size(),
          body_len_, 10);
      if (ec != std::errc{}) {
        body_len_ = -1;
      }
    }
  }